

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O0

void deqp::egl::drawRectangle(Functions *gl,IVec2 *pos,IVec2 *size,Vec3 *color)

{
  GLfloat GVar1;
  GLfloat GVar2;
  GLint GVar3;
  GLint GVar4;
  GLsizei GVar5;
  glClearColorFunc p_Var6;
  glScissorFunc p_Var7;
  GLenum err;
  float *pfVar8;
  int *piVar9;
  Vec3 *color_local;
  IVec2 *size_local;
  IVec2 *pos_local;
  Functions *gl_local;
  
  p_Var6 = gl->clearColor;
  pfVar8 = tcu::Vector<float,_3>::x(color);
  GVar1 = *pfVar8;
  pfVar8 = tcu::Vector<float,_3>::y(color);
  GVar2 = *pfVar8;
  pfVar8 = tcu::Vector<float,_3>::z(color);
  (*p_Var6)(GVar1,GVar2,*pfVar8,1.0);
  p_Var7 = gl->scissor;
  piVar9 = tcu::Vector<int,_2>::x(pos);
  GVar3 = *piVar9;
  piVar9 = tcu::Vector<int,_2>::y(pos);
  GVar4 = *piVar9;
  piVar9 = tcu::Vector<int,_2>::x(size);
  GVar5 = *piVar9;
  piVar9 = tcu::Vector<int,_2>::y(size);
  (*p_Var7)(GVar3,GVar4,GVar5,*piVar9);
  (*gl->enable)(0xc11);
  (*gl->clear)(0x4000);
  (*gl->disable)(0xc11);
  err = (*gl->getError)();
  glu::checkError(err,"Rectangle drawing with glScissor and glClear failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglResizeTests.cpp"
                  ,0xeb);
  return;
}

Assistant:

void drawRectangle (const glw::Functions& gl, IVec2 pos, IVec2 size, Vec3 color)
{
	gl.clearColor(color.x(), color.y(), color.z(), 1.0);
	gl.scissor(pos.x(), pos.y(), size.x(), size.y());
	gl.enable(GL_SCISSOR_TEST);
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.disable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(),
						"Rectangle drawing with glScissor and glClear failed.");
}